

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_writer.h
# Opt level: O0

OutputWriter * __thiscall
uttamarin::OutputWriter::WriteColorized<char_const*>(OutputWriter *this,char *input,TextColor color)

{
  bool bVar1;
  reference ppbVar2;
  basic_ostream<char,_std::char_traits<char>_> *stream;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  TextColor color_local;
  char *input_local;
  OutputWriter *this_local;
  
  __end2._M_current =
       (basic_ostream<char,_std::char_traits<char>_> **)
       CLI::std::
       vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                *)this);
  stream = (basic_ostream<char,_std::char_traits<char>_> *)
           CLI::std::
           vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                *)&stream);
    if (!bVar1) break;
    ppbVar2 = __gnu_cxx::
              __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
              ::operator*(&__end2);
    if ((ostream *)*ppbVar2 == (ostream *)&std::cout) {
      WriteColorized<char_const*>(this,(ostream *)&std::cout,input,color);
    }
    else {
      std::operator<<((ostream *)*ppbVar2,input);
    }
    __gnu_cxx::
    __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
    ::operator++(&__end2);
  }
  return this;
}

Assistant:

OutputWriter& OutputWriter::WriteColorized(T input, TextColor color) {
  for(auto stream : streams_){
    if(stream == &std::cout) WriteColorized(*stream, input, color);
    else *stream << input;
  }
  return *this;
}